

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnData::Filter
          (StandardColumnData *this,TransactionData transaction,idx_t vector_index,
          ColumnScanState *state,Vector *result,SelectionVector *sel,idx_t *count,
          TableFilter *filter,TableFilterState *filter_state)

{
  char cVar1;
  int iVar2;
  reference state_00;
  idx_t target_count;
  ColumnData *this_00;
  bool bVar3;
  bool bVar4;
  optional_ptr<const_duckdb::CompressionFunction,_true> validity_compression;
  optional_ptr<const_duckdb::CompressionFunction,_true> compression;
  
  compression.ptr = (this->super_ColumnData).compression.ptr._M_b._M_p;
  bVar4 = true;
  bVar3 = true;
  if (compression.ptr != (__pointer_type)0x0) {
    optional_ptr<const_duckdb::CompressionFunction,_true>::CheckValid(&compression);
    bVar3 = (compression.ptr)->filter == (compression_filter_t)0x0;
  }
  validity_compression.ptr = (this->validity).super_ColumnData.compression.ptr._M_b._M_p;
  if (validity_compression.ptr != (__pointer_type)0x0) {
    optional_ptr<const_duckdb::CompressionFunction,_true>::CheckValid(&validity_compression);
    bVar4 = (validity_compression.ptr)->filter == (compression_filter_t)0x0;
  }
  target_count = (this->super_ColumnData).count.super___atomic_base<unsigned_long>._M_i +
                 vector_index * -0x800;
  if (0x7ff < target_count) {
    target_count = 0x800;
  }
  iVar2 = (*(this->super_ColumnData)._vptr_ColumnData[5])(this,state,target_count,result);
  if ((state->scan_options).ptr == (TableScanOptions *)0x0) {
    cVar1 = '\0';
  }
  else {
    optional_ptr<duckdb::TableScanOptions,_true>::CheckValid(&state->scan_options);
    cVar1 = ((state->scan_options).ptr)->force_fetch_row;
  }
  if (((bVar3 || bVar4) || (iVar2 != 0)) || (cVar1 != '\0')) {
    ColumnData::Filter(&this->super_ColumnData,transaction,vector_index,state,result,sel,count,
                       filter,filter_state);
  }
  else {
    ColumnData::FilterVector
              ((ColumnData *)filter,state,result,target_count,sel,count,filter,filter_state);
    this_00 = (ColumnData *)&state->child_states;
    state_00 = vector<duckdb::ColumnScanState,_true>::operator[]
                         ((vector<duckdb::ColumnScanState,_true> *)this_00,0);
    ColumnData::FilterVector(this_00,state_00,result,target_count,sel,count,filter,filter_state);
  }
  return;
}

Assistant:

void StandardColumnData::Filter(TransactionData transaction, idx_t vector_index, ColumnScanState &state, Vector &result,
                                SelectionVector &sel, idx_t &count, const TableFilter &filter,
                                TableFilterState &filter_state) {
	// check if we can do a specialized select
	// the compression functions need to support this
	auto compression = GetCompressionFunction();
	bool has_filter = compression && compression->filter;
	auto validity_compression = validity.GetCompressionFunction();
	bool validity_has_filter = validity_compression && validity_compression->filter;
	auto target_count = GetVectorCount(vector_index);
	auto scan_type = GetVectorScanType(state, target_count, result);
	bool scan_entire_vector = scan_type == ScanVectorType::SCAN_ENTIRE_VECTOR;
	bool verify_fetch_row = state.scan_options && state.scan_options->force_fetch_row;
	if (!has_filter || !validity_has_filter || !scan_entire_vector || verify_fetch_row) {
		// we are not scanning an entire vector - this can have several causes (updates, etc)
		ColumnData::Filter(transaction, vector_index, state, result, sel, count, filter, filter_state);
		return;
	}
	FilterVector(state, result, target_count, sel, count, filter, filter_state);
	validity.FilterVector(state.child_states[0], result, target_count, sel, count, filter, filter_state);
}